

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<char,_void_(*)(char_*,_unsigned_long)> * __thiscall
Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::operator=
          (Array<char,_void_(*)(char_*,_unsigned_long)> *this,
          Array<char,_void_(*)(char_*,_unsigned_long)> *other)

{
  char *pcVar1;
  size_t sVar2;
  _func_void_char_ptr_unsigned_long *p_Var3;
  
  pcVar1 = this->_data;
  this->_data = other->_data;
  other->_data = pcVar1;
  sVar2 = this->_size;
  this->_size = other->_size;
  other->_size = sVar2;
  p_Var3 = this->_deleter;
  this->_deleter = other->_deleter;
  other->_deleter = p_Var3;
  return this;
}

Assistant:

inline Array<T, D>& Array<T, D>::operator=(Array<T, D>&& other) noexcept {
    using Utility::swap;
    swap(_data, other._data);
    swap(_size, other._size);
    swap(_deleter, other._deleter);
    return *this;
}